

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O0

void yy_pop_parser_stack(yyParser *pParser)

{
  yyStackEntry *pyVar1;
  yyStackEntry *yytos;
  yyParser *pParser_local;
  
  if (pParser->yytos == (yyStackEntry *)0x0) {
    __assert_fail("pParser->yytos!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                  ,0x248,"void yy_pop_parser_stack(yyParser *)");
  }
  if (pParser->yystack < pParser->yytos) {
    pyVar1 = pParser->yytos;
    pParser->yytos = pyVar1 + -1;
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sPopping %s\n",yyTracePrompt,yyTokenName[pyVar1->major]);
    }
    yy_destructor(pParser,pyVar1->major,&pyVar1->minor);
    return;
  }
  __assert_fail("pParser->yytos > pParser->yystack",
                "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
                ,0x249,"void yy_pop_parser_stack(yyParser *)");
}

Assistant:

static void yy_pop_parser_stack(yyParser *pParser){
  yyStackEntry *yytos;
  assert( pParser->yytos!=0 );
  assert( pParser->yytos > pParser->yystack );
  yytos = pParser->yytos--;
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sPopping %s\n",
      yyTracePrompt,
      yyTokenName[yytos->major]);
  }
#endif
  yy_destructor(pParser, yytos->major, &yytos->minor);
}